

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scope.h
# Opt level: O0

iterator_range<slang::ast::Scope::specific_symbol_iterator<slang::ast::VariableSymbol>_> __thiscall
slang::ast::Scope::membersOfType<slang::ast::VariableSymbol>(Scope *this)

{
  specific_symbol_iterator<slang::ast::VariableSymbol> local_30;
  specific_symbol_iterator<slang::ast::VariableSymbol> local_28;
  Scope *local_20;
  Scope *this_local;
  
  local_20 = this;
  ensureElaborated(this);
  specific_symbol_iterator<slang::ast::VariableSymbol>::specific_symbol_iterator
            (&local_28,this->firstMember);
  specific_symbol_iterator<slang::ast::VariableSymbol>::specific_symbol_iterator
            (&local_30,(Symbol *)0x0);
  iterator_range<slang::ast::Scope::specific_symbol_iterator<slang::ast::VariableSymbol>_>::
  iterator_range((iterator_range<slang::ast::Scope::specific_symbol_iterator<slang::ast::VariableSymbol>_>
                  *)&this_local,local_28,local_30);
  return _this_local;
}

Assistant:

iterator_range<specific_symbol_iterator<T>> membersOfType() const {
        ensureElaborated();
        return {firstMember, nullptr};
    }